

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

Vec_Wrd_t * Vec_WrdReadHex(char *pFileName,int *pnWords,int fVerbose)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  FILE *__stream;
  Vec_Wrd_t *pVVar4;
  word *__ptr;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    return (Vec_Wrd_t *)0x0;
  }
  pVVar4 = Vec_WrdAlloc(1000);
  uVar7 = 0xffffffff;
  do {
    uVar6 = 0;
    iVar8 = 0;
    do {
      do {
        while( true ) {
          uVar3 = fgetc(__stream);
          if (uVar3 == 0xffffffff) {
            iVar8 = pVVar4->nSize;
            if (iVar8 % (int)uVar7 == 0) {
              fclose(__stream);
              printf("Read %d words of simulation data for %d objects.\n",(ulong)uVar7,
                     (long)iVar8 / (long)(int)uVar7 & 0xffffffff);
              return pVVar4;
            }
            __assert_fail("Vec_WrdSize(p) % nWords == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x522,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
          }
          if (uVar3 != 10 || uVar7 != 0xffffffff) break;
          uVar7 = pVVar4->nSize;
        }
      } while ((uVar3 < 0x21) && ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0));
      cVar2 = (char)uVar3;
      iVar5 = -0x30;
      if ((9 < (byte)(cVar2 - 0x30U)) &&
         ((iVar5 = -0x37, 5 < (byte)(cVar2 + 0xbfU) && (iVar5 = -0x57, 5 < (byte)(cVar2 + 0x9fU)))))
      {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x506,"int Vec_WrdReadHexOne(char)");
      }
      uVar6 = uVar6 | (ulong)((uVar3 & 0xff) + iVar5) << ((char)iVar8 * '\x04' & 0x3fU);
      bVar1 = iVar8 < 0xf;
      iVar8 = iVar8 + 1;
    } while (bVar1);
    iVar8 = pVVar4->nSize;
    if (iVar8 == pVVar4->nCap) {
      uVar3 = iVar8 * 2;
      if (iVar8 < 0x10) {
        uVar3 = 0x10;
      }
      __ptr = pVVar4->pArray;
      if (iVar8 < (int)uVar3) {
        if (__ptr == (word *)0x0) {
          __ptr = (word *)malloc((ulong)uVar3 << 3);
        }
        else {
          __ptr = (word *)realloc(__ptr,(ulong)uVar3 << 3);
        }
        pVVar4->pArray = __ptr;
        if (__ptr == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar4->nCap = uVar3;
      }
    }
    else {
      __ptr = pVVar4->pArray;
    }
    pVVar4->nSize = iVar8 + 1;
    __ptr[iVar8] = uVar6;
  } while( true );
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdReadHex( char * pFileName, int * pnWords, int fVerbose )
{
    Vec_Wrd_t * p = NULL; 
    int c, nWords = -1, nChars = 0; word Num = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    p = Vec_WrdAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' && nWords == -1 )
            nWords = Vec_WrdSize(p);
        if ( c == '\n' || c == '\r' || c == '\t' || c == ' ' )
            continue;
        Num |= (word)Vec_WrdReadHexOne((char)c) << (nChars * 4);
        if ( ++nChars < 16 )
            continue;
        Vec_WrdPush( p, Num );
        nChars = 0; 
        Num = 0;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    fclose( pFile );
    if ( pnWords )
        *pnWords = nWords;
    if ( fVerbose )
        printf( "Read %d words of simulation data for %d objects.\n", nWords, Vec_WrdSize(p)/nWords );
    return p;
}